

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec08.c
# Opt level: O0

void If_Dec08Cofactors(word *pF,int nVars,int iVar,word *pCof0,word *pCof1)

{
  word wVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  int local_3c;
  int Step;
  int k;
  int i_1;
  int Shift;
  int i;
  int nWords;
  word *pCof1_local;
  word *pCof0_local;
  int iVar_local;
  int nVars_local;
  word *pF_local;
  
  iVar2 = If_Dec08WordNum(nVars);
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec08.c"
                  ,0x15a,"void If_Dec08Cofactors(word *, int, int, word *, word *)");
  }
  if (iVar < 6) {
    for (i_1 = 0; i_1 < iVar2; i_1 = i_1 + 1) {
      bVar4 = (byte)(1 << ((byte)iVar & 0x1f));
      pCof0[i_1] = pF[i_1] & (Truth6[iVar] ^ 0xffffffffffffffff) |
                   (pF[i_1] & (Truth6[iVar] ^ 0xffffffffffffffff)) << (bVar4 & 0x3f);
      pCof1[i_1] = pF[i_1] & Truth6[iVar] | (pF[i_1] & Truth6[iVar]) >> (bVar4 & 0x3f);
    }
  }
  else {
    iVar3 = 1 << ((byte)iVar - 6 & 0x1f);
    _i = pCof1;
    pCof1_local = pCof0;
    _iVar_local = pF;
    for (local_3c = 0; local_3c < iVar2; local_3c = iVar3 * 2 + local_3c) {
      for (Step = 0; Step < iVar3; Step = Step + 1) {
        wVar1 = _iVar_local[Step];
        pCof1_local[iVar3 + Step] = wVar1;
        pCof1_local[Step] = wVar1;
        wVar1 = _iVar_local[iVar3 + Step];
        _i[iVar3 + Step] = wVar1;
        _i[Step] = wVar1;
      }
      _iVar_local = _iVar_local + (iVar3 << 1);
      pCof1_local = pCof1_local + (iVar3 << 1);
      _i = _i + (iVar3 << 1);
    }
  }
  return;
}

Assistant:

void If_Dec08Cofactors( word * pF, int nVars, int iVar, word * pCof0, word * pCof1 )
{
    int nWords = If_Dec08WordNum( nVars );
    assert( iVar < nVars );
    if ( iVar < 6 )
    {
        int i, Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
        {
            pCof0[i] = (pF[i] & ~Truth6[iVar]) | ((pF[i] & ~Truth6[iVar]) << Shift);
            pCof1[i] = (pF[i] &  Truth6[iVar]) | ((pF[i] &  Truth6[iVar]) >> Shift);
        }
        return;
    }
    else
    {
        int i, k, Step = (1 << (iVar - 6));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                pCof0[i] = pCof0[Step+i] = pF[i];
                pCof1[i] = pCof1[Step+i] = pF[Step+i];
            }
            pF    += 2*Step;
            pCof0 += 2*Step;
            pCof1 += 2*Step;
        }
        return;
    }
}